

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

size_t encode_length(uint8_t *buf,size_t n,size_t prefix)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  byte *pbVar6;
  
  uVar5 = -1 << ((byte)prefix & 0x1f);
  bVar4 = (byte)uVar5 & *buf;
  uVar5 = ~uVar5;
  *buf = bVar4;
  sVar2 = n - uVar5;
  if (uVar5 <= n) {
    *buf = bVar4 | (byte)uVar5;
    pbVar6 = buf + 1;
    uVar3 = sVar2;
    if (0x7f < sVar2) {
      do {
        *pbVar6 = (byte)uVar3 | 0x80;
        sVar2 = uVar3 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar1 = 0x3fff < uVar3;
        uVar3 = sVar2;
      } while (bVar1);
    }
    *pbVar6 = (byte)sVar2;
    return sVar2;
  }
  *buf = bVar4 | (byte)n;
  return sVar2;
}

Assistant:

static size_t encode_length(uint8_t *buf, size_t n, size_t prefix) {
  size_t k = (size_t)((1 << prefix) - 1);
  uint8_t *begin = buf;

  *buf = (uint8_t)(*buf & ~k);

  if (n < k) {
    *buf = (uint8_t)(*buf | n);
    return 1;
  }

  *buf = (uint8_t)(*buf | k);
  ++buf;

  n -= k;

  for (; n >= 128; n >>= 7) {
    *buf++ = (uint8_t)((1 << 7) | (n & 0x7f));
  }

  *buf++ = (uint8_t)n;

  return (size_t)(buf - begin);
}